

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O2

void __thiscall MkvInterface::handleInfo(MkvInterface *this)

{
  int *UpperLevel;
  EbmlStream *pEVar1;
  EbmlUInteger *this_00;
  EbmlFloat *this_01;
  EbmlUnicodeString *pEVar2;
  int iVar3;
  uint32 uVar4;
  undefined4 extraout_var;
  EbmlElement *pEVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  UTFstring *pUVar6;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  char *pcVar7;
  FILE *pFVar8;
  byte bVar9;
  KaxTimecodeScale *TimeScale;
  uint i;
  uint uVar10;
  double dVar11;
  UTFstring local_68;
  
  pEVar1 = this->aStream;
  iVar3 = (*this->m_element1->_vptr_EbmlElement[4])();
  UpperLevel = &this->m_upperElementa;
  pEVar5 = libebml::EbmlStream::FindNextElement
                     (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var,iVar3) + 0x18),
                      UpperLevel,0xffffffff,this->m_allowDummy,1);
  this->m_element2a = pEVar5;
LAB_0018d64e:
  do {
    if ((pEVar5 == (EbmlElement *)0x0) || (0 < *UpperLevel)) goto LAB_0018da58;
    if (*UpperLevel < 0) {
      *UpperLevel = 0;
    }
    if (this->m_verbose == true) {
      fwrite("\tEBML ID: ",10,1,_stderr);
      bVar9 = 8;
      for (uVar10 = 0; iVar3 = (*this->m_element2a->_vptr_EbmlElement[3])(), pFVar8 = _stderr,
          (ulong)uVar10 < *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8); uVar10 = uVar10 + 1) {
        iVar3 = (*this->m_element2a->_vptr_EbmlElement[3])();
        fprintf(pFVar8,"[%02X]",
                (ulong)(*(uint *)CONCAT44(extraout_var_01,iVar3) >> (bVar9 & 0x1f) & 0xff));
        bVar9 = bVar9 - 8;
      }
      fputc(10,_stderr);
      pEVar5 = this->m_element2a;
    }
    iVar3 = (*pEVar5->_vptr_EbmlElement[3])();
    this_00 = (EbmlUInteger *)this->m_element2a;
    if ((*(long *)(libmatroska::KaxTimecodeScale::ClassInfos._8_8_ + 8) ==
         *(long *)((int *)CONCAT44(extraout_var_02,iVar3) + 2)) &&
       (*(int *)libmatroska::KaxTimecodeScale::ClassInfos._8_8_ ==
        *(int *)CONCAT44(extraout_var_02,iVar3))) {
      (*(this_00->super_EbmlElement)._vptr_EbmlElement[10])(this_00,this->aStream->Stream,1);
      pFVar8 = _stderr;
      uVar4 = libebml::EbmlUInteger::operator_cast_to_unsigned_int(this_00);
      fprintf(pFVar8,"\tTimecode Scale : %d\n",(ulong)uVar4);
    }
    else {
      iVar3 = (*(this_00->super_EbmlElement)._vptr_EbmlElement[3])(this_00);
      this_01 = (EbmlFloat *)this->m_element2a;
      if ((*(long *)(libmatroska::KaxDuration::ClassInfos._8_8_ + 8) ==
           *(long *)((int *)CONCAT44(extraout_var_03,iVar3) + 2)) &&
         (*(int *)libmatroska::KaxDuration::ClassInfos._8_8_ ==
          *(int *)CONCAT44(extraout_var_03,iVar3))) {
        (*(this_01->super_EbmlElement)._vptr_EbmlElement[10])(this_01,this->aStream->Stream,1);
        dVar11 = libebml::EbmlFloat::GetValue(this_01);
        this->m_duration = (float)dVar11;
        fprintf(_stderr,"\tSegment duration : %0.2fs\n",(double)(((float)dVar11 * 1000.0) / 1e+06));
      }
      else {
        iVar3 = (*(this_01->super_EbmlElement)._vptr_EbmlElement[3])(this_01);
        if ((*(long *)(libmatroska::KaxDateUTC::ClassInfos._8_8_ + 8) ==
             *(long *)((int *)CONCAT44(extraout_var_04,iVar3) + 2)) &&
           (*(int *)libmatroska::KaxDateUTC::ClassInfos._8_8_ ==
            *(int *)CONCAT44(extraout_var_04,iVar3))) {
          pcVar7 = "\tDate UTC\n";
LAB_0018d80e:
          fwrite(pcVar7,10,1,_stderr);
        }
        else {
          iVar3 = (*this->m_element2a->_vptr_EbmlElement[3])();
          pEVar2 = (EbmlUnicodeString *)this->m_element2a;
          if ((*(long *)(libmatroska::KaxSegmentFilename::ClassInfos._8_8_ + 8) ==
               *(long *)((int *)CONCAT44(extraout_var_05,iVar3) + 2)) &&
             (*(int *)libmatroska::KaxSegmentFilename::ClassInfos._8_8_ ==
              *(int *)CONCAT44(extraout_var_05,iVar3))) {
            (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])(pEVar2,this->aStream->Stream,1);
            pFVar8 = _stderr;
            pUVar6 = libebml::EbmlUnicodeString::operator_cast_to_UTFstring_(pEVar2);
            libebml::UTFstring::UTFstring(&local_68,pUVar6);
            pcVar7 = "\tSegment filename : %s\n";
          }
          else {
            iVar3 = (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[3])(pEVar2);
            pEVar2 = (EbmlUnicodeString *)this->m_element2a;
            if ((*(long *)(libmatroska::KaxMuxingApp::ClassInfos._8_8_ + 8) ==
                 *(long *)((int *)CONCAT44(extraout_var_06,iVar3) + 2)) &&
               (*(int *)libmatroska::KaxMuxingApp::ClassInfos._8_8_ ==
                *(int *)CONCAT44(extraout_var_06,iVar3))) {
              (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])(pEVar2,this->aStream->Stream,1);
              pFVar8 = _stderr;
              pUVar6 = libebml::EbmlUnicodeString::operator_cast_to_UTFstring_(pEVar2);
              libebml::UTFstring::UTFstring(&local_68,pUVar6);
              pcVar7 = "\tMuxing app : %s\n";
            }
            else {
              iVar3 = (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[3])(pEVar2);
              if ((*(long *)(libmatroska::KaxWritingApp::ClassInfos._8_8_ + 8) !=
                   *(long *)((int *)CONCAT44(extraout_var_07,iVar3) + 2)) ||
                 (*(int *)libmatroska::KaxWritingApp::ClassInfos._8_8_ !=
                  *(int *)CONCAT44(extraout_var_07,iVar3))) {
                pcVar7 = "\tOther...\n";
                goto LAB_0018d80e;
              }
              pEVar2 = (EbmlUnicodeString *)this->m_element2a;
              (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])(pEVar2,this->aStream->Stream,1);
              pFVar8 = _stderr;
              pUVar6 = libebml::EbmlUnicodeString::operator_cast_to_UTFstring_(pEVar2);
              libebml::UTFstring::UTFstring(&local_68,pUVar6);
              pcVar7 = "\tWriting app : %s\n";
            }
          }
          fprintf(pFVar8,pcVar7,local_68.UTF8string._M_dataplus._M_p);
          libebml::UTFstring::~UTFstring(&local_68);
        }
      }
    }
    if (0 < *UpperLevel) break;
    pEVar1 = this->aStream;
    pEVar5 = this->m_element2a;
    iVar3 = (*pEVar5->_vptr_EbmlElement[4])(pEVar5);
    libebml::EbmlElement::SkipData
              (pEVar5,pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_08,iVar3) + 0x18),
               (EbmlElement *)0x0,false);
    if (this->m_element2a != (EbmlElement *)0x0) {
      (*this->m_element2a->_vptr_EbmlElement[1])();
    }
    pEVar1 = this->aStream;
    iVar3 = (*this->m_element1->_vptr_EbmlElement[4])();
    pEVar5 = libebml::EbmlStream::FindNextElement
                       (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_09,iVar3) + 0x18),
                        UpperLevel,0xffffffff,this->m_allowDummy,1);
    this->m_element2a = pEVar5;
  } while( true );
  iVar3 = *UpperLevel + -1;
  this->m_upperElementa = iVar3;
  if (this->m_element2a != (EbmlElement *)0x0) {
    (*this->m_element2a->_vptr_EbmlElement[1])();
    iVar3 = *UpperLevel;
  }
  pEVar5 = this->m_element3a;
  this->m_element2a = pEVar5;
  if (0 < iVar3) {
LAB_0018da58:
    fputc(10,_stderr);
    return;
  }
  goto LAB_0018d64e;
}

Assistant:

void MkvInterface::handleInfo()
{
    m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
    
    while (m_element2a != NULL) 
    {
        if (m_upperElementa > 0)
            break;
        if (m_upperElementa < 0)
            m_upperElementa = 0;
    
        //fprintf(stderr, "\tFILE POS = %d, ELEMENT POS = %d\n", m_file->getFilePointer(), m_element2a->GetElementPosition());
        
        if (m_verbose)
        {
            fprintf(stderr, "\tEBML ID: ");
            for (unsigned int i=0; i<EbmlId(*m_element2a).Length; i++)
                fprintf(stderr, "[%02X]", (EbmlId(*m_element2a).Value >> (8*(1-i))) & 0xFF);
            fprintf(stderr, "\n");
        }
        
        if (EbmlId(*m_element2a) == KaxTimecodeScale::ClassInfos.GlobalId)
        {
            KaxTimecodeScale *TimeScale = static_cast<KaxTimecodeScale*>(m_element2a);
            TimeScale->ReadData(aStream->I_O());
            fprintf(stderr, "\tTimecode Scale : %d\n", uint32(*TimeScale));
        }
        else if (EbmlId(*m_element2a) == KaxDuration::ClassInfos.GlobalId)
        {
            KaxDuration *Duration = static_cast<KaxDuration*>(m_element2a);
            Duration->ReadData(aStream->I_O());
            m_duration = Duration->GetValue();
            fprintf(stderr, "\tSegment duration : %0.2fs\n", 1000*m_duration/TIMECODE_SCALE);
        }
        else if (EbmlId(*m_element2a) == KaxDateUTC::ClassInfos.GlobalId)
        {
            fprintf(stderr, "\tDate UTC\n");
        }
        else if (EbmlId(*m_element2a) == KaxSegmentFilename::ClassInfos.GlobalId)
        {
            KaxSegmentFilename *fn = static_cast<KaxSegmentFilename*>(m_element2a);
            fn->ReadData(aStream->I_O());
            fprintf(stderr, "\tSegment filename : %s\n", UTFstring(*fn).GetUTF8().c_str());
        }
        else if (EbmlId(*m_element2a) == KaxMuxingApp::ClassInfos.GlobalId)
        {
            KaxMuxingApp *pApp = static_cast<KaxMuxingApp*>(m_element2a);
            pApp->ReadData(aStream->I_O());
            fprintf(stderr, "\tMuxing app : %s\n", UTFstring(*pApp).GetUTF8().c_str());
        }
        else if (EbmlId(*m_element2a) == KaxWritingApp::ClassInfos.GlobalId)
        {
            KaxWritingApp *pApp = static_cast<KaxWritingApp*>(m_element2a);
            pApp->ReadData(aStream->I_O());
            fprintf(stderr, "\tWriting app : %s\n", UTFstring(*pApp).GetUTF8().c_str());
        }
        else
        {
            fprintf(stderr, "\tOther...\n");
        }
        
        if (m_upperElementa > 0)
        {
            m_upperElementa--;
            delete m_element2a;
            m_element2a = m_element3a;
            if (m_upperElementa > 0)
                break;
        } 
        else
        {
            m_element2a->SkipData(*aStream, m_element2a->Generic().Context);
            delete m_element2a;

            m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
        }
    }
    fprintf(stderr, "\n");
}